

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::GenerateHeader
          (EnumGenerator *this,Printer *printer)

{
  EnumDescriptor *this_00;
  bool bVar1;
  int i32;
  FileDescriptor *pFVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppEVar5;
  char *pcVar6;
  long lVar7;
  undefined1 in_CL;
  undefined1 prefer_single_line;
  EnumValueDescriptor *descriptor;
  AlphaNum *a;
  AlphaNum local_1e0;
  string local_1b0;
  string local_190;
  string local_170;
  allocator local_149;
  string local_148;
  string local_128 [8];
  string comments;
  _Self local_100;
  int local_f4;
  undefined1 local_f0 [4];
  int i;
  string local_d0;
  undefined1 local_a0 [8];
  SourceLocation location;
  string enum_comments;
  Printer *printer_local;
  EnumGenerator *this_local;
  
  std::__cxx11::string::string
            ((string *)
             &location.leading_detached_comments.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  SourceLocation::SourceLocation((SourceLocation *)local_a0);
  bVar1 = EnumDescriptor::GetSourceLocation(this->descriptor_,(SourceLocation *)local_a0);
  if (bVar1) {
    BuildCommentsString_abi_cxx11_
              (&local_d0,(objectivec *)local_a0,(SourceLocation *)0x1,(bool)in_CL);
    std::__cxx11::string::operator=
              ((string *)
               &location.leading_detached_comments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)
               &location.leading_detached_comments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
  }
  io::Printer::Print<char[5],std::__cxx11::string>
            (printer,"#pragma mark - Enum $name$\n\n",(char (*) [5])0x77db8d,&this->name_);
  this_00 = this->descriptor_;
  pFVar2 = EnumDescriptor::file(this_00);
  GetOptionalDeprecatedAttribute<google::protobuf::EnumDescriptor>
            ((string *)local_f0,this_00,pFVar2,true,false);
  io::Printer::
  Print<char[9],std::__cxx11::string,char[21],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,"$comments$typedef$deprecated_attribute$ GPB_ENUM($name$) {\n",
             (char (*) [9])0x7cc1e9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &location.leading_detached_comments.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (char (*) [21])"deprecated_attribute",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
             (char (*) [5])0x77db8d,&this->name_);
  std::__cxx11::string::~string((string *)local_f0);
  io::Printer::Indent(printer);
  pFVar2 = EnumDescriptor::file(this->descriptor_);
  bVar1 = HasPreservingUnknownEnumSemantics(pFVar2);
  if (bVar1) {
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,
               "/**\n * Value used if any message\'s field encounters a value that is not defined\n * by this enum. The message will also have C functions to get/set the rawValue\n * of the field.\n **/\n$name$_GPBUnrecognizedEnumeratorValue = kGPBUnrecognizedEnumeratorValue,\n"
               ,(char (*) [5])0x77db8d,&this->name_);
  }
  for (local_f4 = 0; uVar3 = (ulong)local_f4,
      sVar4 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::size(&this->all_values_), uVar3 < sVar4; local_f4 = local_f4 + 1) {
    ppEVar5 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::operator[](&this->all_values_,(long)local_f4);
    prefer_single_line = (undefined1)sVar4;
    local_100._M_node =
         (_Base_ptr)
         std::
         set<const_google::protobuf::EnumValueDescriptor_*,_std::less<const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
         ::find(&this->alias_values_to_skip_,ppEVar5);
    comments.field_2._8_8_ =
         std::
         set<const_google::protobuf::EnumValueDescriptor_*,_std::less<const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
         ::end(&this->alias_values_to_skip_);
    bVar1 = std::operator!=(&local_100,(_Self *)((long)&comments.field_2 + 8));
    if (!bVar1) {
      ppEVar5 = std::
                vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::operator[](&this->all_values_,(long)local_f4);
      bVar1 = EnumValueDescriptor::GetSourceLocation(*ppEVar5,(SourceLocation *)local_a0);
      if (bVar1) {
        BuildCommentsString_abi_cxx11_
                  (&local_148,(objectivec *)local_a0,(SourceLocation *)0x1,(bool)prefer_single_line)
        ;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_128,pcVar6,&local_149);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
        std::__cxx11::string::~string((string *)&local_148);
        lVar7 = std::__cxx11::string::length();
        if (lVar7 != 0) {
          if (0 < local_f4) {
            io::Printer::Print<>(printer,"\n");
          }
          pcVar6 = (char *)std::__cxx11::string::c_str();
          io::Printer::Print<>(printer,pcVar6);
        }
        std::__cxx11::string::~string(local_128);
      }
      ppEVar5 = std::
                vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::operator[](&this->all_values_,(long)local_f4);
      EnumValueName_abi_cxx11_(&local_170,(objectivec *)*ppEVar5,descriptor);
      ppEVar5 = std::
                vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::operator[](&this->all_values_,(long)local_f4);
      GetOptionalDeprecatedAttribute<google::protobuf::EnumValueDescriptor>
                (&local_190,*ppEVar5,(FileDescriptor *)0x0,true,false);
      ppEVar5 = std::
                vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::operator[](&this->all_values_,(long)local_f4);
      i32 = EnumValueDescriptor::number(*ppEVar5);
      strings::AlphaNum::AlphaNum(&local_1e0,i32);
      StrCat_abi_cxx11_(&local_1b0,(protobuf *)&local_1e0,a);
      io::Printer::
      Print<char[5],std::__cxx11::string,char[21],std::__cxx11::string,char[6],std::__cxx11::string>
                (printer,"$name$$deprecated_attribute$ = $value$,\n",(char (*) [5])0x77db8d,
                 &local_170,(char (*) [21])"deprecated_attribute",&local_190,(char (*) [6])0x7c8c1c,
                 &local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_170);
    }
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<char[5],std::__cxx11::string>
            (printer,
             "};\n\nGPBEnumDescriptor *$name$_EnumDescriptor(void);\n\n/**\n * Checks to see if the given value is defined by the enum or was not known at\n * the time this source was generated.\n **/\nBOOL $name$_IsValidValue(int32_t value);\n\n"
             ,(char (*) [5])0x77db8d,&this->name_);
  SourceLocation::~SourceLocation((SourceLocation *)local_a0);
  std::__cxx11::string::~string
            ((string *)
             &location.leading_detached_comments.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void EnumGenerator::GenerateHeader(io::Printer* printer) {
  std::string enum_comments;
  SourceLocation location;
  if (descriptor_->GetSourceLocation(&location)) {
    enum_comments = BuildCommentsString(location, true);
  } else {
    enum_comments = "";
  }

  printer->Print(
      "#pragma mark - Enum $name$\n"
      "\n",
      "name", name_);

  // Swift 5 included SE0192 "Handling Future Enum Cases"
  //   https://github.com/apple/swift-evolution/blob/master/proposals/0192-non-exhaustive-enums.md
  // Since a .proto file can get new values added to an enum at any time, they
  // are effectively "non-frozen". Even in a proto3 syntax file where there is
  // support for the unknown value, an edit to the file can always add a new
  // value moving something from unknown to known. Since Swift is now ABI
  // stable, it also means a binary could contain Swift compiled against one
  // version of the .pbobjc.h file, but finally linked against an enum with
  // more cases. So the Swift code will always have to treat ObjC Proto Enums
  // as "non-frozen". The default behavior in SE0192 is for all objc enums to
  // be "non-frozen" unless marked as otherwise, so this means this generation
  // doesn't have to bother with the `enum_extensibility` attribute, as the
  // default will be what is needed.

  printer->Print("$comments$typedef$deprecated_attribute$ GPB_ENUM($name$) {\n",
                 "comments", enum_comments,
                 "deprecated_attribute", GetOptionalDeprecatedAttribute(descriptor_, descriptor_->file()),
                 "name", name_);
  printer->Indent();

  if (HasPreservingUnknownEnumSemantics(descriptor_->file())) {
    // Include the unknown value.
    printer->Print(
      "/**\n"
      " * Value used if any message's field encounters a value that is not defined\n"
      " * by this enum. The message will also have C functions to get/set the rawValue\n"
      " * of the field.\n"
      " **/\n"
      "$name$_GPBUnrecognizedEnumeratorValue = kGPBUnrecognizedEnumeratorValue,\n",
      "name", name_);
  }
  for (int i = 0; i < all_values_.size(); i++) {
    if (alias_values_to_skip_.find(all_values_[i]) != alias_values_to_skip_.end()) {
      continue;
    }
    if (all_values_[i]->GetSourceLocation(&location)) {
      std::string comments = BuildCommentsString(location, true).c_str();
      if (comments.length() > 0) {
        if (i > 0) {
          printer->Print("\n");
        }
        printer->Print(comments.c_str());
      }
    }

    printer->Print(
        "$name$$deprecated_attribute$ = $value$,\n",
        "name", EnumValueName(all_values_[i]),
        "deprecated_attribute", GetOptionalDeprecatedAttribute(all_values_[i]),
        "value", StrCat(all_values_[i]->number()));
  }
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n"
      "GPBEnumDescriptor *$name$_EnumDescriptor(void);\n"
      "\n"
      "/**\n"
      " * Checks to see if the given value is defined by the enum or was not known at\n"
      " * the time this source was generated.\n"
      " **/\n"
      "BOOL $name$_IsValidValue(int32_t value);\n"
      "\n",
      "name", name_);
}